

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

void anon_unknown.dwarf_13465d::AddLoadInfo(VmModule *module,VmInstruction *inst)

{
  uint uVar1;
  VmValue **ppVVar2;
  long lVar3;
  LoadStoreInfo *pLVar4;
  uint uVar5;
  TypeBase *pTVar6;
  VmConstant *pVVar7;
  VmConstant *pVVar8;
  VmConstant *pVVar9;
  bool bVar10;
  
  uVar5 = GetAccessSize(inst);
  uVar1 = (inst->arguments).count;
  if ((uVar1 == 0) || (uVar1 == 1)) {
    __assert_fail("index < count",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                  ,0x199,
                  "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]");
  }
  ppVVar2 = (inst->arguments).data;
  pVVar9 = (VmConstant *)*ppVVar2;
  pVVar7 = (VmConstant *)ppVVar2[1];
  if ((pVVar7 == (VmConstant *)0x0) || ((pVVar7->super_VmValue).typeID != 1)) {
    pVVar7 = (VmConstant *)0x0;
  }
  if ((pVVar9 == (VmConstant *)0x0) || (pVVar8 = pVVar9, (pVVar9->super_VmValue).typeID != 1)) {
    pVVar8 = (VmConstant *)0x0;
  }
  if (pVVar8 == (VmConstant *)0x0) {
    pVVar8 = (VmConstant *)0x0;
  }
  else {
    if (pVVar8->container == (VariableData *)0x0) {
      return;
    }
    if (pVVar7->iValue != 0) {
      __assert_fail("loadOffset->iValue == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x5b0,"void (anonymous namespace)::AddLoadInfo(VmModule *, VmInstruction *)");
    }
    pTVar6 = pVVar8->container->type;
    if ((pTVar6 == (TypeBase *)0x0) || (pTVar6->typeID != 0x13)) {
      pTVar6 = (TypeBase *)0x0;
    }
    if ((pTVar6 != (TypeBase *)0x0) &&
       (lVar3._0_4_ = pTVar6[1].typeID, lVar3._4_4_ = pTVar6[1].nameHash, 0x20 < lVar3)) {
      return;
    }
    pVVar7 = (VmConstant *)0x0;
    pVVar9 = (VmConstant *)0x0;
  }
  bVar10 = pVVar8 == (VmConstant *)0x0 && pVVar9 == (VmConstant *)0x0;
  if (pVVar8 != (VmConstant *)0x0) {
    if (pVVar8->container == (VariableData *)0x0) {
      bVar10 = false;
    }
    else {
      bVar10 = HasAddressTaken(pVVar8->container);
      bVar10 = !bVar10;
    }
  }
  uVar1 = (module->loadStoreInfo).count;
  if (uVar1 == (module->loadStoreInfo).max) {
    SmallArray<VmModule::LoadStoreInfo,_32U>::grow(&module->loadStoreInfo,uVar1);
  }
  pLVar4 = (module->loadStoreInfo).data;
  if (pLVar4 != (LoadStoreInfo *)0x0) {
    uVar1 = (module->loadStoreInfo).count;
    (module->loadStoreInfo).count = uVar1 + 1;
    pLVar4[uVar1].loadInst = inst;
    pLVar4[uVar1].storeInst = (VmInstruction *)0x0;
    (&pLVar4[uVar1].storeInst)[1] = (VmInstruction *)0x0;
    pLVar4[uVar1].accessSize = uVar5;
    pLVar4[uVar1].loadAddress = pVVar8;
    pLVar4[uVar1].loadPointer = &pVVar9->super_VmValue;
    pLVar4[uVar1].loadOffset = pVVar7;
    pLVar4[uVar1].storeAddress = (VmConstant *)0x0;
    (&pLVar4[uVar1].storeAddress)[1] = (VmConstant *)0x0;
    pLVar4[uVar1].storeOffset = (VmConstant *)0x0;
    pLVar4[uVar1].noLoadOrNoContainerAlias = bVar10;
    pLVar4[uVar1].noStoreOrNoContainerAlias = true;
    return;
  }
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,
                "void SmallArray<VmModule::LoadStoreInfo, 32>::push_back(const T &) [T = VmModule::LoadStoreInfo, N = 32]"
               );
}

Assistant:

void AddLoadInfo(VmModule *module, VmInstruction* inst)
	{
		VmModule::LoadStoreInfo info;

		info.loadInst = inst;

		info.accessSize = GetAccessSize(inst);

		VmValue *loadPointer = inst->arguments[0];
		VmConstant *loadOffset = getType<VmConstant>(inst->arguments[1]);

		if(VmConstant *loadAddress = getType<VmConstant>(loadPointer))
		{
			if(!loadAddress->container)
				return;

			assert(loadOffset->iValue == 0);

			// Do not track load-store into large arrays
			if(TypeArray *typeArray = getType<TypeArray>(loadAddress->container->type))
			{
				if(typeArray->length > 32)
					return;
			}

			info.loadAddress = loadAddress;
		}
		else
		{
			info.loadPointer = loadPointer;
			info.loadOffset = loadOffset;
		}

		info.noLoadOrNoContainerAlias = !(info.loadAddress || info.loadPointer) || (info.loadAddress && info.loadAddress->container && !HasAddressTaken(info.loadAddress->container));
		info.noStoreOrNoContainerAlias = !(info.storeAddress || info.storePointer) || (info.storeAddress && info.storeAddress->container && !HasAddressTaken(info.storeAddress->container));

		module->loadStoreInfo.push_back(info);
	}